

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

AnalyzedReferences * __thiscall
jaegertracing::Tracer::analyzeReferences
          (AnalyzedReferences *__return_storage_ptr__,Tracer *this,
          vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
          *references)

{
  SpanContext *pSVar1;
  bool bVar2;
  element_type *peVar3;
  StrMap *this_00;
  bool bVar4;
  SpanContext *local_170;
  Reference local_148;
  allocator local_79;
  string local_78 [32];
  SpanContext *local_58;
  SpanContext *ctx;
  pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*> *ref;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
  *__range1;
  SpanContext *parent;
  bool hasParent;
  vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
  *references_local;
  Tracer *this_local;
  AnalyzedReferences *result;
  
  AnalyzedReferences::AnalyzedReferences(__return_storage_ptr__);
  bVar4 = false;
  __range1 = (vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
              *)__return_storage_ptr__->_parent;
  __end1 = std::
           vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
           ::begin(references);
  ref = (pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*> *)
        std::
        vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
        ::end(references);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_*,_std::vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>_>
                                *)&ref);
    if (!bVar2) {
      if (((!bVar4) &&
          (__range1 !=
           (vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
            *)0x0)) && (bVar2 = SpanContext::isValid((SpanContext *)__range1), bVar2)) {
        bVar4 = true;
      }
      if (bVar4) {
        if (__range1 ==
            (vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
             *)0x0) {
          __assert_fail("parent",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/Tracer.cpp"
                        ,0xef,
                        "Tracer::AnalyzedReferences jaegertracing::Tracer::analyzeReferences(const std::vector<OpenTracingRef> &) const"
                       );
        }
        __return_storage_ptr__->_parent = (SpanContext *)__range1;
      }
      return __return_storage_ptr__;
    }
    ctx = (SpanContext *)
          __gnu_cxx::
          __normal_iterator<const_std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_*,_std::vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>_>
          ::operator*(&__end1);
    pSVar1 = (SpanContext *)(ctx->_traceID)._high;
    if (pSVar1 == (SpanContext *)0x0) {
      local_170 = (SpanContext *)0x0;
    }
    else {
      local_170 = (SpanContext *)
                  __dynamic_cast(pSVar1,&opentracing::v3::SpanContext::typeinfo,
                                 &SpanContext::typeinfo,0);
    }
    local_58 = local_170;
    if (local_170 == (SpanContext *)0x0) {
      peVar3 = std::
               __shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->_logger);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_78,"Reference contains invalid type of SpanReference",&local_79);
      (*peVar3->_vptr_Logger[2])(peVar3,local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else {
      bVar2 = SpanContext::isValid(local_170);
      if ((!bVar2) && (bVar2 = SpanContext::isDebugIDContainerOnly(local_58), !bVar2)) {
        this_00 = SpanContext::baggage_abi_cxx11_(local_58);
        bVar2 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty(this_00);
        if (bVar2) goto LAB_003610d7;
      }
      if (*(int *)&(ctx->super_SpanContext)._vptr_SpanContext == 99) {
        __return_storage_ptr__->_self = local_58;
      }
      else {
        Reference::Reference
                  (&local_148,local_58,*(Type *)&(ctx->super_SpanContext)._vptr_SpanContext);
        std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::
        emplace_back<jaegertracing::Reference>(&__return_storage_ptr__->_references,&local_148);
        Reference::~Reference(&local_148);
        if (!bVar4) {
          __range1 = (vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
                      *)local_58;
          bVar4 = *(int *)&(ctx->super_SpanContext)._vptr_SpanContext == 1;
        }
      }
    }
LAB_003610d7:
    __gnu_cxx::
    __normal_iterator<const_std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_*,_std::vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

Tracer::AnalyzedReferences
Tracer::analyzeReferences(const std::vector<OpenTracingRef>& references) const
{
    AnalyzedReferences result;
    auto hasParent = false;
    const auto* parent = result._parent;
    for (auto&& ref : references) {
        const auto* ctx = dynamic_cast<const SpanContext*>(ref.second);

        if (!ctx) {
            _logger->error("Reference contains invalid type of SpanReference");
            continue;
        }

        if (!ctx->isValid() && !ctx->isDebugIDContainerOnly() &&
            ctx->baggage().empty()) {
            continue;
        }

        if (static_cast<int>(ref.first) == SpanReferenceType_JaegerSpecific_SelfRef)
        {
            result._self = ctx;
            continue; // not a reference
        }

        result._references.emplace_back(Reference(*ctx, ref.first));

        if (!hasParent) {
            parent = ctx;
            hasParent =
                (ref.first == opentracing::SpanReferenceType::ChildOfRef);
        }
    }

    if (!hasParent && parent && parent->isValid()) {
        // Use `FollowsFromRef` in place of `ChildOfRef`.
        hasParent = true;
    }

    if (hasParent) {
        assert(parent);
        result._parent = parent;
    }

    return result;
}